

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpcollisionlist.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPCollisionList::UpdateAddress
          (RTPCollisionList *this,RTPAddress *addr,RTPTime *receivetime,bool *created)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  reference pAVar4;
  RTPMemoryManager *pRVar5;
  undefined4 extraout_var;
  AddressAndTime local_68;
  RTPAddress *local_58;
  RTPAddress *newaddr;
  _Self local_48;
  _List_node_base *local_40;
  _List_iterator<jrtplib::RTPCollisionList::AddressAndTime> local_38;
  iterator it;
  bool *created_local;
  RTPTime *receivetime_local;
  RTPAddress *addr_local;
  RTPCollisionList *this_local;
  
  if (addr == (RTPAddress *)0x0) {
    this_local._4_4_ = -3;
  }
  else {
    it._M_node = (_List_node_base *)created;
    std::_List_iterator<jrtplib::RTPCollisionList::AddressAndTime>::_List_iterator(&local_38);
    local_40 = (_List_node_base *)
               std::__cxx11::
               list<jrtplib::RTPCollisionList::AddressAndTime,_std::allocator<jrtplib::RTPCollisionList::AddressAndTime>_>
               ::begin(&this->addresslist);
    local_38._M_node = local_40;
    while( true ) {
      local_48._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<jrtplib::RTPCollisionList::AddressAndTime,_std::allocator<jrtplib::RTPCollisionList::AddressAndTime>_>
           ::end(&this->addresslist);
      bVar1 = std::operator!=(&local_38,&local_48);
      if (!bVar1) break;
      pAVar4 = std::_List_iterator<jrtplib::RTPCollisionList::AddressAndTime>::operator*(&local_38);
      uVar2 = (*pAVar4->addr->_vptr_RTPAddress[1])();
      if ((uVar2 & 1) != 0) {
        pAVar4 = std::_List_iterator<jrtplib::RTPCollisionList::AddressAndTime>::operator*
                           (&local_38);
        (pAVar4->recvtime).m_t = receivetime->m_t;
        *(undefined1 *)&(it._M_node)->_M_next = 0;
        return 0;
      }
      newaddr = (RTPAddress *)
                std::_List_iterator<jrtplib::RTPCollisionList::AddressAndTime>::operator++
                          (&local_38,0);
    }
    pRVar5 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
    iVar3 = (**addr->_vptr_RTPAddress)(addr,pRVar5);
    local_58 = (RTPAddress *)CONCAT44(extraout_var,iVar3);
    if (local_58 == (RTPAddress *)0x0) {
      this_local._4_4_ = -1;
    }
    else {
      AddressAndTime::AddressAndTime(&local_68,local_58,receivetime);
      std::__cxx11::
      list<jrtplib::RTPCollisionList::AddressAndTime,_std::allocator<jrtplib::RTPCollisionList::AddressAndTime>_>
      ::push_back(&this->addresslist,&local_68);
      *(undefined1 *)&(it._M_node)->_M_next = 1;
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int RTPCollisionList::UpdateAddress(const RTPAddress *addr,const RTPTime &receivetime,bool *created)
{
	if (addr == 0)
		return ERR_RTP_COLLISIONLIST_BADADDRESS;
	
	std::list<AddressAndTime>::iterator it;
	
	for (it = addresslist.begin() ; it != addresslist.end() ; it++)
	{
		if (((*it).addr)->IsSameAddress(addr))
		{
			(*it).recvtime = receivetime;
			*created = false;
			return 0;
		}
	}

	RTPAddress *newaddr = addr->CreateCopy(GetMemoryManager());
	if (newaddr == 0)
		return ERR_RTP_OUTOFMEM;
	
	addresslist.push_back(AddressAndTime(newaddr,receivetime));
	*created = true;
	return 0;
}